

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_dse_ahstore(jit_State *J)

{
  byte bVar1;
  ushort uVar2;
  IRRef1 IVar3;
  ushort uVar4;
  AliasRet AVar5;
  TRef TVar6;
  ulong uVar7;
  IRIns *pIVar8;
  IRRef1 *pIVar9;
  IRIns *pIVar10;
  
  uVar2 = (J->fold).ins.field_0.op1;
  bVar1 = (J->fold).ins.field_1.o;
  uVar4 = J->chain[bVar1];
  if (uVar2 < uVar4) {
    IVar3 = (J->fold).ins.field_0.op2;
    pIVar8 = (J->cur).ir;
    pIVar9 = J->chain + bVar1;
    do {
      pIVar10 = pIVar8 + uVar4;
      AVar5 = aa_ahref(J,pIVar8 + uVar2,pIVar8 + (pIVar10->field_0).op1);
      if (AVar5 == ALIAS_MAY) {
        if ((pIVar10->field_0).op2 != IVar3) break;
      }
      else if (AVar5 == ALIAS_MUST) {
        if ((pIVar10->field_0).op2 == IVar3) {
          return 4;
        }
        if (J->chain[0x11] < uVar4) {
          uVar7 = (ulong)((J->cur).nins - 1);
          if (uVar7 <= uVar4) goto LAB_0011c26a;
          pIVar8 = pIVar8 + uVar7;
          goto LAB_0011c255;
        }
        break;
      }
      uVar4 = (pIVar10->field_0).prev;
      pIVar9 = &(pIVar10->field_0).prev;
    } while (uVar2 < uVar4);
  }
  goto LAB_0011c1f5;
  while (pIVar8 = pIVar8 + -1, pIVar10 < pIVar8) {
LAB_0011c255:
    if (((char)(pIVar8->field_1).t.irt < '\0') || ((pIVar8->field_1).o == 'I')) goto LAB_0011c1f5;
  }
LAB_0011c26a:
  *pIVar9 = (pIVar10->field_0).prev;
  *pIVar10 = (IRIns)0xc0000000000;
LAB_0011c1f5:
  TVar6 = lj_ir_emit(J);
  return TVar6;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ahstore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[fins->o];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads).
	** Note that lj_tab_keyindex and lj_vm_next don't need guards,
	** since they are followed by at least one guarded VLOAD.
	*/
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || ir->o == IR_ALEN)
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}